

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::lsd_peer_alert::~lsd_peer_alert(lsd_peer_alert *this)

{
  lsd_peer_alert *this_local;
  
  peer_alert::~peer_alert(&this->super_peer_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT lsd_peer_alert final : peer_alert
	{
		// internal
		TORRENT_UNEXPORT lsd_peer_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& i);

		TORRENT_DEFINE_ALERT(lsd_peer_alert, 60)

		static inline constexpr alert_category_t static_category = alert_category::peer;
		std::string message() const override;
	}